

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-curse.c
# Opt level: O2

_Bool textui_get_curse(int *choice,object *obj,char *dice_string)

{
  ulong uVar1;
  _Bool _Var2;
  int iVar3;
  menu *menu;
  void *p;
  size_t sVar4;
  char *src;
  uint uVar5;
  long lVar6;
  wchar_t row;
  ulong uVar7;
  int iVar8;
  angband_constants *paVar9;
  ulong local_e0;
  menu_iter menu_f;
  char header [80];
  
  menu_f.resize = (_func_void_menu_ptr *)0x0;
  menu_f.display_row = get_curse_display;
  menu_f.row_handler = get_curse_action;
  menu_f.get_tag = (_func_char_menu_ptr_int *)0x0;
  menu_f.valid_row = (_func_int_menu_ptr_int *)0x0;
  menu = menu_new(MN_SKIN_SCROLL,&menu_f);
  p = mem_zalloc((ulong)z_info->curse_max << 3);
  iVar8 = 0;
  lVar6 = 8;
  local_e0 = 0;
  paVar9 = z_info;
  for (uVar7 = 1; uVar7 < paVar9->curse_max; uVar7 = uVar7 + 1) {
    if ((uint)(obj->known->curses[uVar7].power + L'\xffffffff') < 99) {
      _Var2 = player_knows_curse(player,(wchar_t)uVar7);
      paVar9 = z_info;
      if (_Var2) {
        *(wchar_t *)((long)p + (long)iVar8 * 8) = (wchar_t)uVar7;
        *(wchar_t *)((long)p + (long)iVar8 * 8 + 4) = obj->curses[uVar7].power;
        sVar4 = strlen(*(char **)(curses->conflict_flags + lVar6 * 8 + -0x28));
        uVar1 = sVar4 + 0xd;
        if (sVar4 + 0xd <= local_e0) {
          uVar1 = local_e0;
        }
        local_e0 = uVar1 & 0xffffffff;
        iVar8 = iVar8 + 1;
      }
    }
    lVar6 = lVar6 + 7;
  }
  if (iVar8 == 0) {
    mem_free(p);
    _Var2 = false;
  }
  else {
    menu_setpriv(menu,iVar8,p);
    src = format(" Remove which curse (spell strength %s)?",dice_string);
    my_strcpy(header,src,0x50);
    menu->header = header;
    menu->selections = "abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
    menu->flags = 4;
    menu->browse_hook = curse_menu_browser;
    selection = L'\0';
    iVar8 = menu->count + 2;
    DAT_002d8244 = 1;
    uVar5 = ~(uint)local_e0 + Term->wid;
    curse_menu_area = uVar5 >> 1;
    if (uVar5 < 8) {
      curse_menu_area = 0;
    }
    uVar5 = (uint)local_e0 + 1;
    DAT_002d824c = iVar8;
    sVar4 = strlen(menu->header);
    _DAT_002d8248 = (uint)sVar4;
    if (sVar4 <= uVar5) {
      _DAT_002d8248 = uVar5;
    }
    iVar3 = 1;
    for (row = L'\x01'; row < iVar8 + iVar3; row = row + L'\x01') {
      uVar5 = curse_menu_area;
      if ((int)curse_menu_area < 2) {
        uVar5 = 1;
      }
      prt("",row,uVar5 + L'\xffffffff');
      iVar8 = DAT_002d824c;
      iVar3 = DAT_002d8244;
    }
    menu_layout(menu,(region *)&curse_menu_area);
    _Var2 = false;
    menu_select(menu,0,true);
    mem_free(p);
    mem_free(menu);
    if (selection != L'\0') {
      *choice = selection;
      _Var2 = true;
    }
  }
  return _Var2;
}

Assistant:

bool textui_get_curse(int *choice, struct object *obj, char *dice_string)
{
	int curse = curse_menu(obj, dice_string);
	if (curse) {
		*choice = curse;
		return true;
	}
	return false;
}